

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<double>::GrowNoAnnotate
          (RepeatedField<double> *this,bool was_soo,int old_size,int new_size)

{
  byte bVar1;
  int iVar2;
  int v2;
  char *pcVar3;
  LogMessage *pLVar4;
  unsigned_long uVar5;
  unsigned_long *puVar6;
  void *pvVar7;
  double *__src;
  double *pold;
  double *pnew;
  ulong local_e8;
  unsigned_long local_e0;
  size_t num_available;
  SizedPtr res;
  Voidify local_b1;
  unsigned_long local_b0;
  unsigned_long local_a8;
  Nullable<const_char_*> local_a0;
  Nullable<const_char_*> absl_log_internal_check_op_result_2;
  size_t bytes;
  LogMessage local_80;
  Voidify local_69;
  unsigned_long local_68;
  unsigned_long local_60;
  Nullable<const_char_*> local_58;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  Arena *arena;
  HeapRep *new_rep;
  Voidify local_29;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  int old_capacity;
  int new_size_local;
  int old_size_local;
  bool was_soo_local;
  RepeatedField<double> *this_local;
  
  absl_log_internal_check_op_result._4_4_ = new_size;
  old_capacity = old_size;
  new_size_local._3_1_ = was_soo;
  _old_size_local = this;
  absl_log_internal_check_op_result._0_4_ = Capacity(this,was_soo);
  iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue
                    (absl_log_internal_check_op_result._4_4_);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue
                 ((int)absl_log_internal_check_op_result);
  local_28 = absl::lts_20250127::log_internal::Check_GTImpl(iVar2,v2,"new_size > old_capacity");
  if (local_28 != (Nullable<const_char_*>)0x0) {
    pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_28);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&new_rep,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x4ad,pcVar3);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&new_rep);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&new_rep)
    ;
  }
  absl_log_internal_check_op_result_1 = (Nullable<const_char_*>)GetArena(this);
  absl_log_internal_check_op_result._4_4_ =
       internal::CalculateReserveSize<double,8>
                 ((int)absl_log_internal_check_op_result,absl_log_internal_check_op_result._4_4_);
  local_60 = absl::lts_20250127::log_internal::GetReferenceableValue
                       ((long)absl_log_internal_check_op_result._4_4_);
  uVar5 = std::numeric_limits<unsigned_long>::max();
  local_68 = absl::lts_20250127::log_internal::GetReferenceableValue(uVar5 - 8 >> 3);
  local_58 = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                       (&local_60,&local_68,
                        "static_cast<size_t>(new_size) <= (std::numeric_limits<size_t>::max() - kHeapRepHeaderSize) / sizeof(Element)"
                       );
  if (local_58 != (Nullable<const_char_*>)0x0) {
    pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_58);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6,pcVar3);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar4,(char (*) [48])"Requested size is too large to fit into size_t.");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_80);
  }
  absl_log_internal_check_op_result_2 =
       (Nullable<const_char_*>)((long)absl_log_internal_check_op_result._4_4_ * 8 + 8);
  if (absl_log_internal_check_op_result_1 == (Nullable<const_char_*>)0x0) {
    local_a8 = absl::lts_20250127::log_internal::GetReferenceableValue
                         ((long)absl_log_internal_check_op_result._4_4_ & 0x1fffffffffffffff);
    iVar2 = std::numeric_limits<int>::max();
    local_b0 = absl::lts_20250127::log_internal::GetReferenceableValue((long)iVar2);
    local_a0 = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                         (&local_a8,&local_b0,
                          "(bytes - kHeapRepHeaderSize) / sizeof(Element) <= static_cast<size_t>(std::numeric_limits<int>::max())"
                         );
    if (local_a0 != (Nullable<const_char_*>)0x0) {
      pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_a0);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&res.n,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4bc,pcVar3);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&res.n);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar4,(char (*) [59])
                                 "Requested size is too large to fit element count into int.");
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_b1,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&res.n)
      ;
    }
    _num_available = internal::AllocateAtLeast((size_t)absl_log_internal_check_op_result_2);
    local_e8 = (long)res.p - 8U >> 3;
    iVar2 = std::numeric_limits<int>::max();
    pnew = (double *)(long)iVar2;
    puVar6 = std::min<unsigned_long>(&local_e8,(unsigned_long *)&pnew);
    local_e0 = *puVar6;
    absl_log_internal_check_op_result._4_4_ = (int)local_e0;
    arena = (Arena *)num_available;
  }
  else {
    arena = (Arena *)Arena::CreateArray<char>
                               ((Arena *)absl_log_internal_check_op_result_1,
                                (size_t)absl_log_internal_check_op_result_2);
  }
  (arena->impl_).tag_and_id_ = (uint64_t)absl_log_internal_check_op_result_1;
  if (0 < old_capacity) {
    pvVar7 = internal::HeapRep<8UL>::elements((HeapRep<8UL> *)arena);
    __src = elements(this,(bool)(new_size_local._3_1_ & 1));
    memcpy(pvVar7,__src,(long)old_capacity << 3);
  }
  if ((new_size_local._3_1_ & 1) == 0) {
    InternalDeallocate<false>(this);
  }
  bVar1 = new_size_local._3_1_;
  iVar2 = absl_log_internal_check_op_result._4_4_;
  pvVar7 = internal::HeapRep<8UL>::elements((HeapRep<8UL> *)arena);
  internal::SooRep::set_non_soo(&this->soo_rep_,(bool)(bVar1 & 1),iVar2,pvVar7);
  return;
}

Assistant:

PROTOBUF_NOINLINE void RepeatedField<Element>::GrowNoAnnotate(bool was_soo,
                                                              int old_size,
                                                              int new_size) {
  const int old_capacity = Capacity(was_soo);
  ABSL_DCHECK_GT(new_size, old_capacity);
  HeapRep* new_rep;
  Arena* arena = GetArena();

  new_size = internal::CalculateReserveSize<Element, kHeapRepHeaderSize>(
      old_capacity, new_size);

  ABSL_DCHECK_LE(static_cast<size_t>(new_size),
                 (std::numeric_limits<size_t>::max() - kHeapRepHeaderSize) /
                     sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes =
      kHeapRepHeaderSize + sizeof(Element) * static_cast<size_t>(new_size);
  if (arena == nullptr) {
    ABSL_DCHECK_LE((bytes - kHeapRepHeaderSize) / sizeof(Element),
                   static_cast<size_t>(std::numeric_limits<int>::max()))
        << "Requested size is too large to fit element count into int.";
    internal::SizedPtr res = internal::AllocateAtLeast(bytes);
    size_t num_available =
        std::min((res.n - kHeapRepHeaderSize) / sizeof(Element),
                 static_cast<size_t>(std::numeric_limits<int>::max()));
    new_size = static_cast<int>(num_available);
    new_rep = static_cast<HeapRep*>(res.p);
  } else {
    new_rep =
        reinterpret_cast<HeapRep*>(Arena::CreateArray<char>(arena, bytes));
  }
  new_rep->arena = arena;

  if (old_size > 0) {
    Element* pnew = static_cast<Element*>(new_rep->elements());
    Element* pold = elements(was_soo);
    // TODO: add absl::is_trivially_relocatable<Element>
    if (std::is_trivial<Element>::value) {
      memcpy(static_cast<void*>(pnew), pold, old_size * sizeof(Element));
    } else {
      for (Element* end = pnew + old_size; pnew != end; ++pnew, ++pold) {
        ::new (static_cast<void*>(pnew)) Element(std::move(*pold));
        pold->~Element();
      }
    }
  }
  if (!was_soo) InternalDeallocate();

  soo_rep_.set_non_soo(was_soo, new_size, new_rep->elements());
}